

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterYs<short>,ImPlot::TransformerLogLog>
               (GetterYs<short> *getter,TransformerLogLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  short sVar6;
  ImPlotPlot *pIVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  int iVar14;
  ImPlotContext *gp;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar11 = GImPlot;
  pIVar7 = GImPlot->CurrentPlot;
  if (((pIVar7->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar13 = getter->Count;
    local_48 = iVar13 + -1;
    sVar6 = *(short *)((long)getter->Ys +
                      (long)((getter->Offset % iVar13 + iVar13) % iVar13) * (long)getter->Stride);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar8 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar7->XAxis).Range.Min);
    pIVar7 = pIVar11->CurrentPlot;
    dVar2 = pIVar11->LogDenX;
    dVar3 = (pIVar7->XAxis).Range.Min;
    dVar4 = (pIVar7->XAxis).Range.Max;
    dVar9 = log10((double)(int)sVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
    iVar13 = transformer->YAxis;
    pIVar7 = pIVar11->CurrentPlot;
    auVar19._8_8_ = dVar9;
    auVar19._0_8_ = dVar8;
    auVar22._8_8_ = pIVar11->LogDenY[iVar13];
    auVar22._0_8_ = dVar2;
    auVar17 = divpd(auVar19,auVar22);
    dVar2 = pIVar7->YAxis[iVar13].Range.Min;
    IVar5 = pIVar11->PixelRange[iVar13].Min;
    local_3c.y = (float)(pIVar11->My[iVar13] *
                         (((double)(float)auVar17._8_8_ * (pIVar7->YAxis[iVar13].Range.Max - dVar2)
                          + dVar2) - dVar2) + (double)IVar5.y);
    local_3c.x = (float)(pIVar11->Mx *
                         (((double)(float)auVar17._0_8_ * (dVar4 - dVar3) + dVar3) -
                         (pIVar7->XAxis).Range.Min) + (double)IVar5.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterYs<short>,ImPlot::TransformerLogLog>>
              ((LineStripRenderer<ImPlot::GetterYs<short>,_ImPlot::TransformerLogLog> *)local_58,
               DrawList,&pIVar7->PlotRect);
  }
  else {
    iVar13 = getter->Count;
    sVar6 = *(short *)((long)getter->Ys +
                      (long)((getter->Offset % iVar13 + iVar13) % iVar13) * (long)getter->Stride);
    dVar8 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar7->XAxis).Range.Min);
    pIVar7 = pIVar11->CurrentPlot;
    dVar2 = pIVar11->LogDenX;
    dVar3 = (pIVar7->XAxis).Range.Min;
    dVar4 = (pIVar7->XAxis).Range.Max;
    dVar9 = log10((double)(int)sVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
    iVar13 = transformer->YAxis;
    pIVar7 = pIVar11->CurrentPlot;
    auVar20._8_8_ = pIVar11->LogDenY[iVar13];
    auVar20._0_8_ = dVar2;
    auVar17._8_8_ = dVar9;
    auVar17._0_8_ = dVar8;
    auVar17 = divpd(auVar17,auVar20);
    dVar2 = pIVar7->YAxis[iVar13].Range.Min;
    IVar5 = pIVar11->PixelRange[iVar13].Min;
    local_58._4_4_ =
         (float)(pIVar11->My[iVar13] *
                 (((double)(float)auVar17._8_8_ * (pIVar7->YAxis[iVar13].Range.Max - dVar2) + dVar2)
                 - dVar2) + (double)IVar5.y);
    local_58._0_4_ =
         (float)(pIVar11->Mx *
                 (((double)(float)auVar17._0_8_ * (dVar4 - dVar3) + dVar3) -
                 (pIVar7->XAxis).Range.Min) + (double)IVar5.x);
    iVar13 = getter->Count;
    if (1 < iVar13) {
      iVar14 = 1;
      do {
        pIVar12 = GImPlot;
        sVar6 = *(short *)((long)getter->Ys +
                          (long)(((getter->Offset + iVar14) % iVar13 + iVar13) % iVar13) *
                          (long)getter->Stride);
        dVar8 = log10(((double)iVar14 * getter->XScale + getter->X0) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar7 = pIVar12->CurrentPlot;
        dVar2 = pIVar12->LogDenX;
        dVar3 = (pIVar7->XAxis).Range.Min;
        dVar4 = (pIVar7->XAxis).Range.Max;
        dVar9 = log10((double)(int)sVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
        iVar13 = transformer->YAxis;
        pIVar7 = pIVar12->CurrentPlot;
        auVar18._8_8_ = dVar9;
        auVar18._0_8_ = dVar8;
        auVar21._8_8_ = pIVar12->LogDenY[iVar13];
        auVar21._0_8_ = dVar2;
        auVar17 = divpd(auVar18,auVar21);
        dVar2 = pIVar7->YAxis[iVar13].Range.Min;
        IVar5 = pIVar12->PixelRange[iVar13].Min;
        fVar15 = (float)(pIVar12->Mx *
                         (((double)(float)auVar17._0_8_ * (dVar4 - dVar3) + dVar3) -
                         (pIVar7->XAxis).Range.Min) + (double)IVar5.x);
        fVar16 = (float)(pIVar12->My[iVar13] *
                         (((double)(float)auVar17._8_8_ * (pIVar7->YAxis[iVar13].Range.Max - dVar2)
                          + dVar2) - dVar2) + (double)IVar5.y);
        local_60.y = fVar16;
        local_60.x = fVar15;
        pIVar7 = pIVar11->CurrentPlot;
        fVar10 = (float)local_58._4_4_;
        if (fVar16 <= (float)local_58._4_4_) {
          fVar10 = fVar16;
        }
        if ((fVar10 < (pIVar7->PlotRect).Max.y) &&
           (fVar10 = (float)(~-(uint)(fVar16 <= (float)local_58._4_4_) & (uint)fVar16 |
                            local_58._4_4_ & -(uint)(fVar16 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar7->PlotRect).Min.y, *pfVar1 <= fVar10 && fVar10 != *pfVar1)) {
          fVar10 = (float)local_58._0_4_;
          if (fVar15 <= (float)local_58._0_4_) {
            fVar10 = fVar15;
          }
          if ((fVar10 < (pIVar7->PlotRect).Max.x) &&
             (fVar10 = (float)(-(uint)(fVar15 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar15 <= (float)local_58._0_4_) & (uint)fVar15),
             (pIVar7->PlotRect).Min.x <= fVar10 && fVar10 != (pIVar7->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar14 = iVar14 + 1;
        iVar13 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar14 < iVar13);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}